

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,uint new_capacity)

{
  uint *puVar1;
  undefined8 uVar2;
  uint uVar3;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar4;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar5;
  long lVar6;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,0xc,object_mover,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,0xc,object_mover,false);
    if (&local_28 != this) {
      if (local_28.m_capacity < this->m_size) {
        if (local_28.m_p != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
          crnlib_free(local_28.m_p);
          local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
          local_28.m_size = 0;
          local_28.m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_28,this->m_size,false,0xc,object_mover,false);
      }
      else if (local_28.m_size != 0) {
        local_28._8_8_ = (ulong)local_28.m_capacity << 0x20;
      }
      uVar3 = this->m_size;
      if (uVar3 != 0) {
        ppVar4 = this->m_p;
        ppVar5 = local_28.m_p;
        do {
          lVar6 = 0;
          do {
            (ppVar5->first).m_s[lVar6] = (ppVar4->first).m_s[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar6 == 1);
          puVar1 = &ppVar4->second;
          ppVar4 = ppVar4 + 1;
          ppVar5->second = *puVar1;
          ppVar5 = ppVar5 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      local_28.m_size = this->m_size;
    }
    ppVar4 = this->m_p;
    this->m_p = local_28.m_p;
    uVar2._0_4_ = this->m_size;
    uVar2._4_4_ = this->m_capacity;
    this->m_size = local_28.m_size;
    this->m_capacity = local_28.m_capacity;
    if (ppVar4 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
      local_28.m_p = ppVar4;
      local_28._8_8_ = uVar2;
      crnlib_free(ppVar4);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }